

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::makeNullConstant(Builder *this,Id typeId)

{
  int iVar1;
  Id IVar2;
  size_type sVar3;
  reference ppIVar4;
  Instruction *this_00;
  value_type local_40;
  Instruction *local_38;
  Instruction *c;
  int i;
  Id existing;
  Instruction *constant;
  Builder *pBStack_18;
  Id typeId_local;
  Builder *this_local;
  
  c._4_4_ = 0;
  c._0_4_ = 0;
  constant._4_4_ = typeId;
  pBStack_18 = this;
  while( true ) {
    iVar1 = (int)c;
    sVar3 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::size
                      (&this->nullConstants);
    if ((int)sVar3 <= iVar1) break;
    ppIVar4 = std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::operator[]
                        (&this->nullConstants,(long)(int)c);
    _i = *ppIVar4;
    IVar2 = spv::Instruction::getTypeId(_i);
    if (IVar2 == constant._4_4_) {
      c._4_4_ = spv::Instruction::getResultId(_i);
    }
    c._0_4_ = (int)c + 1;
  }
  if (c._4_4_ == 0) {
    this_00 = (Instruction *)::operator_new(0x60);
    IVar2 = getUniqueId(this);
    spv::Instruction::Instruction(this_00,IVar2,constant._4_4_,OpConstantNull);
    local_38 = this_00;
    std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
    unique_ptr<std::default_delete<spv::Instruction>,void>
              ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
               this_00);
    std::
    vector<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>,_std::allocator<std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>_>_>
    ::push_back(&this->constantsTypesGlobals,&local_40);
    std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr
              (&local_40);
    std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back
              (&this->nullConstants,&local_38);
    Module::mapInstruction(&this->module,local_38);
    this_local._4_4_ = spv::Instruction::getResultId(local_38);
  }
  else {
    this_local._4_4_ = c._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::makeNullConstant(Id typeId)
{
    Instruction* constant;

    // See if we already made it.
    Id existing = NoResult;
    for (int i = 0; i < (int)nullConstants.size(); ++i) {
        constant = nullConstants[i];
        if (constant->getTypeId() == typeId)
            existing = constant->getResultId();
    }

    if (existing != NoResult)
        return existing;

    // Make it
    Instruction* c = new Instruction(getUniqueId(), typeId, OpConstantNull);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(c));
    nullConstants.push_back(c);
    module.mapInstruction(c);

    return c->getResultId();
}